

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

object pybind11::detail::get_python_state_dict(void)

{
  handle in_RDI;
  object local_18;
  
  (in_RDI.m_ptr)->ob_refcnt = 0;
  local_18.super_handle.m_ptr = (handle)PyEval_GetBuiltins();
  if (local_18.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_18.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_18.super_handle.m_ptr)->ob_refcnt + 1;
  }
  object::operator=((object *)in_RDI.m_ptr,&local_18);
  object::~object(&local_18);
  if ((in_RDI.m_ptr)->ob_refcnt == 0) {
    raise_from(_PyExc_SystemError,"pybind11::detail::get_python_state_dict() FAILED");
  }
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

inline object get_python_state_dict() {
    object state_dict;
#if PYBIND11_INTERNALS_VERSION <= 4 || PY_VERSION_HEX < 0x03080000 || defined(PYPY_VERSION)
    state_dict = reinterpret_borrow<object>(PyEval_GetBuiltins());
#else
#    if PY_VERSION_HEX < 0x03090000
    PyInterpreterState *istate = _PyInterpreterState_Get();
#    else
    PyInterpreterState *istate = PyInterpreterState_Get();
#    endif
    if (istate) {
        state_dict = reinterpret_borrow<object>(PyInterpreterState_GetDict(istate));
    }
#endif
    if (!state_dict) {
        raise_from(PyExc_SystemError, "pybind11::detail::get_python_state_dict() FAILED");
    }
    return state_dict;
}